

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O2

void deqp::gles2::Functional::anon_unknown_0::logVertexFragmentProgram
               (TestLog *log,RenderContext *renderCtx,Program *program,Shader *vertShader,
               Shader *fragShader)

{
  Shader *__n;
  void *__buf;
  undefined1 local_50 [40];
  
  __n = vertShader;
  tcu::LogShaderProgram::LogShaderProgram
            ((LogShaderProgram *)local_50,(program->m_info).linkOk,&(program->m_info).infoLog);
  tcu::LogShaderProgram::write((LogShaderProgram *)local_50,(int)log,__buf,(size_t)__n);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  logShader(log,renderCtx,vertShader);
  logShader(log,renderCtx,fragShader);
  tcu::TestLog::endShaderProgram(log);
  return;
}

Assistant:

void logVertexFragmentProgram (TestLog& log, glu::RenderContext& renderCtx, glu::Program& program, glu::Shader& vertShader, glu::Shader& fragShader)
{
	DE_ASSERT(vertShader.getType() == glu::SHADERTYPE_VERTEX && fragShader.getType() == glu::SHADERTYPE_FRAGMENT);

	log << TestLog::ShaderProgram(program.getLinkStatus(), program.getInfoLog());

	logShader(log, renderCtx, vertShader);
	logShader(log, renderCtx, fragShader);

	log << TestLog::EndShaderProgram;
}